

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reshape_x86.cpp
# Opt level: O0

int __thiscall
ncnn::Reshape_x86::forward
          (Reshape_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int *piVar1;
  const_reference pvVar2;
  int iVar3;
  ulong uVar4;
  undefined8 *in_RCX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  bool bVar5;
  __m128 _v;
  int i_2;
  float *outptr_2;
  float *ptr;
  int q_1;
  __m128 tmp0_1;
  __m128 tmp1_1;
  __m128 tmp2_1;
  __m128 tmp3_1;
  __m128 _row3_1;
  __m128 _row2_1;
  __m128 _row1_1;
  __m128 _row0_1;
  int i_1;
  float *outptr_1;
  float *ptr3_1;
  float *ptr2_1;
  float *ptr1_1;
  float *ptr0_1;
  int q;
  int size;
  Option opt_flatten_1;
  Mat bottom_blob_flattened_1;
  size_t out_elemsize_1;
  int out_elempack_1;
  __m128 tmp0;
  __m128 tmp1;
  __m128 tmp2;
  __m128 tmp3;
  __m128 _row3;
  __m128 _row2;
  __m128 _row1;
  __m128 _row0;
  int j;
  float *outptr;
  float *ptr3;
  float *ptr2;
  float *ptr1;
  float *ptr0;
  int i;
  Option opt_flatten;
  Mat bottom_blob_flattened;
  size_t out_elemsize;
  int out_elempack;
  int total;
  size_t elemsize;
  int elempack;
  int dims;
  int er;
  int outc;
  int outd;
  int outh;
  int outw;
  Mat *top_blob;
  Mat *bottom_blob;
  Mat *m_1;
  Mat *m;
  size_t in_stack_fffffffffffff1f8;
  Allocator *in_stack_fffffffffffff200;
  void **ppvVar6;
  size_t in_stack_fffffffffffff208;
  Mat *in_stack_fffffffffffff210;
  undefined8 in_stack_fffffffffffff218;
  Mat *in_stack_fffffffffffff220;
  Mat *in_stack_fffffffffffff228;
  Mat *in_stack_fffffffffffff230;
  int *in_stack_fffffffffffff238;
  int *in_stack_fffffffffffff240;
  undefined4 in_stack_fffffffffffff248;
  undefined4 in_stack_fffffffffffff24c;
  undefined4 in_stack_fffffffffffff250;
  undefined4 in_stack_fffffffffffff254;
  undefined4 in_stack_fffffffffffff258;
  undefined4 in_stack_fffffffffffff25c;
  int in_stack_fffffffffffff270;
  undefined4 in_stack_fffffffffffff278;
  undefined4 in_stack_fffffffffffff27c;
  undefined4 in_stack_fffffffffffff280;
  undefined4 in_stack_fffffffffffff284;
  int local_c58;
  int local_c54;
  int local_c50;
  int local_c4c;
  int local_c48;
  int local_c44;
  int local_ae8;
  int local_ae4;
  int local_aac;
  undefined8 local_aa8;
  undefined8 local_aa0;
  undefined8 local_a98;
  undefined4 local_a90;
  Allocator *local_a88;
  undefined4 local_a80;
  undefined4 local_a7c;
  undefined4 local_a78;
  undefined4 local_a74;
  undefined4 local_a70;
  undefined8 local_a68;
  undefined8 *local_a60;
  undefined8 *local_a58;
  int local_a4c;
  undefined8 local_a48;
  undefined8 uStack_a40;
  undefined8 local_a38;
  undefined8 uStack_a30;
  undefined8 local_a28;
  undefined8 uStack_a20;
  undefined8 local_a18;
  undefined8 uStack_a10;
  undefined8 local_a08;
  undefined8 uStack_a00;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  int local_9c4;
  undefined8 local_9c0;
  undefined8 local_9b8;
  undefined8 local_9b0;
  undefined4 local_9a8;
  Allocator *local_9a0;
  undefined4 local_998;
  undefined4 local_994;
  undefined4 local_990;
  undefined4 local_98c;
  undefined4 local_988;
  undefined8 local_980;
  undefined8 *local_978;
  undefined8 *local_970;
  undefined8 *local_968;
  undefined8 *local_960;
  undefined8 *local_958;
  int local_950;
  int local_94c;
  undefined8 local_948;
  undefined8 uStack_940;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined8 local_918;
  undefined8 uStack_910;
  void *local_900;
  int *local_8f8;
  size_t local_8f0;
  int local_8e8;
  Allocator *local_8e0;
  int local_8d8;
  int local_8d4;
  int local_8d0;
  int local_8cc;
  int local_8c8;
  size_t local_8c0;
  long local_8b8;
  int local_8ac;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined8 local_888;
  undefined8 uStack_880;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 local_868;
  undefined8 uStack_860;
  undefined8 local_858;
  undefined8 uStack_850;
  undefined8 local_848;
  undefined8 uStack_840;
  undefined8 local_838;
  undefined8 uStack_830;
  int local_81c;
  undefined8 *local_818;
  undefined8 *local_810;
  undefined8 *local_808;
  undefined8 *local_800;
  undefined8 *local_7f8;
  int local_7ec;
  int local_7e8;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  void *local_790;
  int *local_788;
  size_t local_780;
  int local_778;
  Allocator *local_770;
  int local_768;
  int local_764;
  int local_760;
  int local_75c;
  int local_758;
  size_t local_750;
  size_t local_748;
  int local_740;
  int local_73c;
  ulong local_738;
  int local_72c;
  int local_728;
  undefined4 local_724;
  int local_720;
  int local_71c;
  int local_718;
  int local_714;
  const_reference local_710;
  const_reference local_708;
  undefined8 *local_700;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_6f8;
  int local_6dc;
  const_reference local_6d8;
  void **local_6d0;
  const_reference local_6c8;
  void **local_6c0;
  int local_6a8;
  undefined4 local_6a4;
  const_reference local_6a0;
  const_reference local_698;
  int local_688;
  undefined4 local_684;
  const_reference local_680;
  const_reference local_678;
  const_reference local_668;
  void **local_660;
  const_reference local_658;
  void **local_650;
  void **local_648;
  void **local_640;
  void **local_638;
  void **local_630;
  void **local_628;
  void **local_620;
  void **local_618;
  void **local_610;
  void **local_608;
  int local_5fc;
  const_reference local_5f8;
  undefined8 *local_5f0;
  undefined8 *local_5e8;
  undefined8 *local_5e0;
  undefined8 *local_5d8;
  undefined8 *local_5d0;
  undefined8 *local_5c8;
  undefined8 *local_5c0;
  undefined8 *local_5b8;
  undefined8 *local_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 *local_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 *local_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 *local_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 *local_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 *local_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 *local_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 *local_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 *local_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 *local_298;
  void **local_290;
  undefined8 *local_280;
  undefined8 *local_270;
  void **local_260;
  undefined1 local_24d;
  int local_24c;
  const_reference local_248;
  undefined8 *local_240;
  undefined1 local_22d;
  int local_22c;
  const_reference local_228;
  undefined8 *local_220;
  undefined8 *local_210;
  undefined8 *local_208;
  void **local_1f0;
  const_reference local_1e8;
  void **local_1e0;
  const_reference local_1d8;
  int local_1a0;
  undefined4 local_19c;
  void **local_198;
  undefined8 *local_178;
  undefined8 *local_158;
  int local_140;
  undefined4 local_13c;
  void **local_138;
  int local_130;
  undefined4 local_12c;
  const_reference local_128;
  int local_120;
  undefined4 local_11c;
  const_reference local_118;
  void *local_110;
  void *local_108;
  void *local_100;
  void *local_d0;
  int local_b0;
  undefined4 local_ac;
  void **local_a8;
  int local_a0;
  undefined4 local_9c;
  void **local_98;
  Allocator *local_90;
  int local_84;
  size_t local_80;
  undefined8 *local_78;
  int local_6c;
  int local_68;
  int local_64;
  undefined8 *local_60;
  Allocator *local_58;
  int local_4c;
  size_t local_48;
  undefined8 *local_40;
  int local_34;
  int local_30;
  int local_2c;
  undefined8 *local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  long local_8;
  
  local_700 = in_RCX;
  local_6f8 = in_RDX;
  local_708 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_710 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_6f8,0);
  local_714 = *(int *)(in_RDI + 0xd0);
  local_718 = *(int *)(in_RDI + 0xd4);
  local_71c = *(int *)(in_RDI + 0xd8);
  local_720 = *(int *)(in_RDI + 0xdc);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    iVar3 = Reshape::eval_shape_expr
                      ((Reshape *)CONCAT44(in_stack_fffffffffffff25c,in_stack_fffffffffffff258),
                       (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                       CONCAT44(in_stack_fffffffffffff254,in_stack_fffffffffffff250),
                       (int *)CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248),
                       in_stack_fffffffffffff240,in_stack_fffffffffffff238,
                       (int *)in_stack_fffffffffffff230);
    if (iVar3 != 0) {
      return -1;
    }
    local_724 = 0;
  }
  pvVar2 = local_710;
  if (*(int *)(in_RDI + 0xe0) == 1) {
    flatten(in_stack_fffffffffffff230,in_stack_fffffffffffff228,(Option *)in_stack_fffffffffffff220)
    ;
    bVar5 = true;
    if (local_710->data != (void *)0x0) {
      bVar5 = local_710->cstep * (long)local_710->c == 0;
    }
    if (!bVar5) {
      return 0;
    }
    return -100;
  }
  local_728 = local_708->dims;
  local_72c = local_708->elempack;
  local_738 = local_708->elemsize;
  local_73c = local_708->w * local_708->h * local_708->d * local_708->c * local_72c;
  if (*(int *)(in_RDI + 0xe0) == 2) {
    if (local_714 == 0) {
      if (local_728 == 1) {
        local_ae4 = local_708->w * local_72c;
      }
      else {
        local_ae4 = local_708->w;
      }
      local_714 = local_ae4;
    }
    if (local_718 == 0) {
      if (local_728 == 2) {
        local_ae8 = local_708->h * local_72c;
      }
      else {
        local_ae8 = local_708->h;
      }
      local_718 = local_ae8;
    }
    if (local_714 == -1) {
      local_714 = local_73c / local_718;
    }
    if (local_718 == -1) {
      local_718 = local_73c / local_714;
    }
    local_740 = 1;
    if (((*(byte *)((long)local_700 + 0x27) & 1) != 0) && (local_740 = 1, local_718 % 4 == 0)) {
      local_740 = 4;
    }
    local_748 = (local_738 / (ulong)(long)local_72c) * (long)local_740;
    if (((local_728 == 2) && (local_708->h * local_72c == local_718)) && (local_72c == local_740)) {
      local_678 = local_710;
      local_680 = local_708;
      if (local_710 != local_708) {
        if (local_708->refcount != (int *)0x0) {
          piVar1 = local_708->refcount;
          local_684 = 1;
          LOCK();
          local_688 = *piVar1;
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        local_128 = local_710;
        if (local_710->refcount != (int *)0x0) {
          piVar1 = local_710->refcount;
          local_12c = 0xffffffff;
          LOCK();
          local_130 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_130 == 1) {
            if (local_710->allocator == (Allocator *)0x0) {
              local_108 = local_710->data;
              if (local_108 != (void *)0x0) {
                free(local_108);
              }
            }
            else {
              (*local_710->allocator->_vptr_Allocator[3])
                        (local_710->allocator,local_710->data,local_738 % (ulong)(long)local_72c);
            }
          }
        }
        pvVar2->data = (void *)0x0;
        pvVar2->elemsize = 0;
        pvVar2->elempack = 0;
        pvVar2->dims = 0;
        pvVar2->w = 0;
        pvVar2->h = 0;
        pvVar2->d = 0;
        pvVar2->c = 0;
        pvVar2->cstep = 0;
        pvVar2->refcount = (int *)0x0;
        pvVar2->data = local_680->data;
        pvVar2->refcount = local_680->refcount;
        pvVar2->elemsize = local_680->elemsize;
        pvVar2->elempack = local_680->elempack;
        pvVar2->allocator = local_680->allocator;
        pvVar2->dims = local_680->dims;
        pvVar2->w = local_680->w;
        pvVar2->h = local_680->h;
        pvVar2->d = local_680->d;
        pvVar2->c = local_680->c;
        pvVar2->cstep = local_680->cstep;
      }
      return 0;
    }
    if (local_740 == 1) {
      flatten(in_stack_fffffffffffff230,in_stack_fffffffffffff228,
              (Option *)in_stack_fffffffffffff220);
      bVar5 = true;
      if (local_710->data != (void *)0x0) {
        bVar5 = local_710->cstep * (long)local_710->c == 0;
      }
      if (!bVar5) {
        local_710->dims = 2;
        local_710->w = local_714;
        local_710->h = local_718;
        local_710->cstep = (long)local_714 * (long)local_718;
        local_710->elemsize = local_748;
        local_710->elempack = local_740;
        return 0;
      }
      return -100;
    }
    local_660 = &local_790;
    local_668 = local_708;
    local_790 = local_708->data;
    local_788 = local_708->refcount;
    local_780 = local_708->elemsize;
    local_778 = local_708->elempack;
    local_770 = local_708->allocator;
    local_768 = local_708->dims;
    local_764 = local_708->w;
    local_760 = local_708->h;
    local_75c = local_708->d;
    local_758 = local_708->c;
    local_750 = local_708->cstep;
    if (local_788 != (int *)0x0) {
      local_9c = 1;
      LOCK();
      local_a0 = *local_788;
      *local_788 = *local_788 + 1;
      UNLOCK();
    }
    local_7d8 = *local_700;
    local_7c8 = local_700[2];
    uStack_7c0 = local_700[3];
    local_7b8 = local_700[4];
    uStack_7b0 = local_700[5];
    local_7a8 = local_700[6];
    uStack_7a0 = local_700[7];
    uStack_7d0 = local_700[2];
    local_98 = local_660;
    flatten(in_stack_fffffffffffff230,in_stack_fffffffffffff228,(Option *)in_stack_fffffffffffff220)
    ;
    local_6c0 = &local_790;
    if (local_790 != (void *)0x0) {
      local_1f0 = local_6c0;
    }
    if (local_790 != (void *)0x0 && local_750 * (long)local_758 != 0) {
      Mat::create(in_stack_fffffffffffff220,(int)((ulong)in_stack_fffffffffffff218 >> 0x20),
                  (int)in_stack_fffffffffffff218,(size_t)in_stack_fffffffffffff210,
                  (int)(in_stack_fffffffffffff208 >> 0x20),in_stack_fffffffffffff200);
      local_6c8 = local_710;
      bVar5 = true;
      if (local_710->data != (void *)0x0) {
        local_1e8 = local_710;
        bVar5 = local_710->cstep * (long)local_710->c == 0;
      }
      if (bVar5) {
        local_6dc = -100;
        local_7e8 = 1;
      }
      else {
        if (local_740 == 4) {
          for (local_7ec = 0; local_7ec < local_710->h; local_7ec = local_7ec + 1) {
            local_608 = &local_790;
            local_7f8 = (undefined8 *)((long)local_790 + (long)(local_714 * local_7ec * 4) * 4);
            local_610 = &local_790;
            local_800 = (undefined8 *)
                        ((long)local_790 + (long)(local_714 * (local_7ec * 4 + 1)) * 4);
            local_618 = &local_790;
            local_808 = (undefined8 *)
                        ((long)local_790 + (long)(local_714 * (local_7ec * 4 + 2)) * 4);
            local_620 = &local_790;
            local_810 = (undefined8 *)
                        ((long)local_790 + (long)(local_714 * (local_7ec * 4 + 3)) * 4);
            local_5f8 = local_710;
            local_5fc = local_7ec;
            local_818 = (undefined8 *)
                        ((long)local_710->data +
                        (long)local_710->w * (long)local_7ec * local_710->elemsize);
            for (local_81c = 0; local_81c + 3 < local_714; local_81c = local_81c + 4) {
              local_5b0 = local_7f8;
              local_4b8 = *local_7f8;
              uStack_530 = local_7f8[1];
              local_5b8 = local_800;
              local_4c8 = *local_800;
              uStack_540 = local_800[1];
              local_5c0 = local_808;
              local_4d8 = *local_808;
              uStack_550 = local_808[1];
              local_5c8 = local_810;
              local_4e8 = *local_810;
              uStack_560 = local_810[1];
              local_538._0_4_ = (undefined4)local_4b8;
              local_538._4_4_ = (undefined4)((ulong)local_4b8 >> 0x20);
              local_548._0_4_ = (undefined4)local_4c8;
              local_548._4_4_ = (undefined4)((ulong)local_4c8 >> 0x20);
              local_8a8 = CONCAT44((undefined4)local_548,(undefined4)local_538);
              uStack_8a0 = CONCAT44(local_548._4_4_,local_538._4_4_);
              local_558._0_4_ = (undefined4)local_4d8;
              local_558._4_4_ = (undefined4)((ulong)local_4d8 >> 0x20);
              local_568._0_4_ = (undefined4)local_4e8;
              local_568._4_4_ = (undefined4)((ulong)local_4e8 >> 0x20);
              local_888 = CONCAT44((undefined4)local_568,(undefined4)local_558);
              uStack_880 = CONCAT44(local_568._4_4_,local_558._4_4_);
              uStack_4b0._0_4_ = (undefined4)uStack_530;
              uStack_4b0._4_4_ = (undefined4)((ulong)uStack_530 >> 0x20);
              uStack_4c0._0_4_ = (undefined4)uStack_540;
              uStack_4c0._4_4_ = (undefined4)((ulong)uStack_540 >> 0x20);
              local_898 = CONCAT44((undefined4)uStack_4c0,(undefined4)uStack_4b0);
              uStack_890 = CONCAT44(uStack_4c0._4_4_,uStack_4b0._4_4_);
              uStack_4d0._0_4_ = (undefined4)uStack_550;
              uStack_4d0._4_4_ = (undefined4)((ulong)uStack_550 >> 0x20);
              uStack_4e0._0_4_ = (undefined4)uStack_560;
              uStack_4e0._4_4_ = (undefined4)((ulong)uStack_560 >> 0x20);
              local_878 = CONCAT44((undefined4)uStack_4e0,(undefined4)uStack_4d0);
              uStack_870 = CONCAT44(uStack_4e0._4_4_,uStack_4d0._4_4_);
              local_838 = CONCAT44((undefined4)local_548,(undefined4)local_538);
              uStack_830 = CONCAT44((undefined4)local_568,(undefined4)local_558);
              local_848 = CONCAT44(local_548._4_4_,local_538._4_4_);
              uStack_840 = CONCAT44(local_568._4_4_,local_558._4_4_);
              local_858 = CONCAT44((undefined4)uStack_4c0,(undefined4)uStack_4b0);
              uStack_850 = CONCAT44((undefined4)uStack_4e0,(undefined4)uStack_4d0);
              local_868 = CONCAT44(uStack_4c0._4_4_,uStack_4b0._4_4_);
              uStack_860 = CONCAT44(uStack_4e0._4_4_,uStack_4d0._4_4_);
              local_298 = local_818;
              *local_818 = local_838;
              local_818[1] = uStack_830;
              local_2b0 = local_818 + 2;
              *local_2b0 = local_848;
              local_818[3] = uStack_840;
              local_2d0 = local_818 + 4;
              *local_2d0 = local_858;
              local_818[5] = uStack_850;
              local_2f0 = local_818 + 6;
              *local_2f0 = local_868;
              local_818[7] = uStack_860;
              local_7f8 = local_7f8 + 2;
              local_800 = local_800 + 2;
              local_808 = local_808 + 2;
              local_810 = local_810 + 2;
              local_818 = local_818 + 8;
              local_568 = local_4e8;
              local_558 = local_4d8;
              local_548 = local_4c8;
              local_538 = local_4b8;
              uStack_4e0 = uStack_560;
              uStack_4d0 = uStack_550;
              uStack_4c0 = uStack_540;
              uStack_4b0 = uStack_530;
              local_468 = local_878;
              uStack_460 = uStack_870;
              local_458 = local_898;
              uStack_450 = uStack_890;
              local_448 = local_888;
              uStack_440 = uStack_880;
              local_438 = local_8a8;
              uStack_430 = uStack_8a0;
              local_3e8 = local_898;
              uStack_3e0 = uStack_890;
              local_3d8 = local_878;
              uStack_3d0 = uStack_870;
              local_3c8 = local_8a8;
              uStack_3c0 = uStack_8a0;
              local_3b8 = local_888;
              uStack_3b0 = uStack_880;
              local_308 = local_868;
              uStack_300 = uStack_860;
              local_2e8 = local_858;
              uStack_2e0 = uStack_850;
              local_2c8 = local_848;
              uStack_2c0 = uStack_840;
              local_2a8 = local_838;
              uStack_2a0 = uStack_830;
            }
            for (; local_81c < local_714; local_81c = local_81c + 1) {
              *(undefined4 *)local_818 = *(undefined4 *)local_7f8;
              *(undefined4 *)((long)local_818 + 4) = *(undefined4 *)local_800;
              *(undefined4 *)(local_818 + 1) = *(undefined4 *)local_808;
              *(undefined4 *)((long)local_818 + 0xc) = *(undefined4 *)local_810;
              local_818 = local_818 + 2;
              local_810 = (undefined8 *)((long)local_810 + 4);
              local_808 = (undefined8 *)((long)local_808 + 4);
              local_800 = (undefined8 *)((long)local_800 + 4);
              local_7f8 = (undefined8 *)((long)local_7f8 + 4);
            }
          }
        }
        local_7e8 = 0;
      }
    }
    else {
      local_6dc = -100;
      local_7e8 = 1;
    }
    local_290 = &local_790;
    local_138 = local_290;
    if (local_788 != (int *)0x0) {
      local_13c = 0xffffffff;
      LOCK();
      local_140 = *local_788;
      *local_788 = *local_788 + -1;
      UNLOCK();
      if (local_140 == 1) {
        if (local_770 == (Allocator *)0x0) {
          local_100 = local_790;
          if (local_790 != (void *)0x0) {
            free(local_790);
          }
        }
        else {
          (*local_770->_vptr_Allocator[3])(local_770,local_790);
        }
      }
    }
    local_790 = (void *)0x0;
    local_780 = 0;
    local_778 = 0;
    local_768 = 0;
    local_764 = 0;
    local_760 = 0;
    local_75c = 0;
    local_758 = 0;
    local_750 = 0;
    local_788 = (int *)0x0;
    if (local_7e8 != 0) {
      return local_6dc;
    }
  }
  pvVar2 = local_710;
  if ((*(int *)(in_RDI + 0xe0) == 3) || (*(int *)(in_RDI + 0xe0) == 4)) {
    if (*(int *)(in_RDI + 0xe0) == 3) {
      if (local_714 == 0) {
        if (local_728 == 1) {
          local_c44 = local_708->w * local_72c;
        }
        else {
          local_c44 = local_708->w;
        }
        local_714 = local_c44;
      }
      if (local_718 == 0) {
        if (local_728 == 2) {
          local_c48 = local_708->h * local_72c;
        }
        else {
          local_c48 = local_708->h;
        }
        local_718 = local_c48;
      }
      if (local_720 == 0) {
        if (local_728 == 3) {
          local_c4c = local_708->c * local_72c;
        }
        else {
          local_c4c = local_708->c;
        }
        local_720 = local_c4c;
      }
      if (local_714 == -1) {
        local_714 = (int)((long)((ulong)(uint)((int)((long)local_73c / (long)local_720) >> 0x1f) <<
                                 0x20 | (long)local_73c / (long)local_720 & 0xffffffffU) /
                         (long)local_718);
      }
      if (local_718 == -1) {
        local_718 = (int)((long)((ulong)(uint)((int)((long)local_73c / (long)local_720) >> 0x1f) <<
                                 0x20 | (long)local_73c / (long)local_720 & 0xffffffffU) /
                         (long)local_714);
      }
      if (local_720 == -1) {
        local_720 = (int)((long)((ulong)(uint)((int)((long)local_73c / (long)local_718) >> 0x1f) <<
                                 0x20 | (long)local_73c / (long)local_718 & 0xffffffffU) /
                         (long)local_714);
      }
      local_71c = 1;
    }
    else {
      if (local_714 == 0) {
        if (local_728 == 1) {
          local_c50 = local_708->w * local_72c;
        }
        else {
          local_c50 = local_708->w;
        }
        local_714 = local_c50;
      }
      if (local_718 == 0) {
        if (local_728 == 2) {
          local_c54 = local_708->h * local_72c;
        }
        else {
          local_c54 = local_708->h;
        }
        local_718 = local_c54;
      }
      if (local_71c == 0) {
        local_71c = local_708->d;
      }
      if (local_720 == 0) {
        if ((local_728 == 3) || (local_728 == 4)) {
          local_c58 = local_708->c * local_72c;
        }
        else {
          local_c58 = local_708->c;
        }
        local_720 = local_c58;
      }
      if (local_714 == -1) {
        uVar4 = (long)((ulong)(uint)((int)((long)local_73c / (long)local_720) >> 0x1f) << 0x20 |
                      (long)local_73c / (long)local_720 & 0xffffffffU) / (long)local_71c;
        local_714 = (int)((long)((ulong)(uint)((int)uVar4 >> 0x1f) << 0x20 | uVar4 & 0xffffffff) /
                         (long)local_718);
      }
      if (local_718 == -1) {
        uVar4 = (long)((ulong)(uint)((int)((long)local_73c / (long)local_720) >> 0x1f) << 0x20 |
                      (long)local_73c / (long)local_720 & 0xffffffffU) / (long)local_71c;
        local_718 = (int)((long)((ulong)(uint)((int)uVar4 >> 0x1f) << 0x20 | uVar4 & 0xffffffff) /
                         (long)local_714);
      }
      if (local_71c == -1) {
        uVar4 = (long)((ulong)(uint)((int)((long)local_73c / (long)local_720) >> 0x1f) << 0x20 |
                      (long)local_73c / (long)local_720 & 0xffffffffU) / (long)local_718;
        local_71c = (int)((long)((ulong)(uint)((int)uVar4 >> 0x1f) << 0x20 | uVar4 & 0xffffffff) /
                         (long)local_714);
      }
      if (local_720 == -1) {
        uVar4 = (long)((ulong)(uint)((int)((long)local_73c / (long)local_71c) >> 0x1f) << 0x20 |
                      (long)local_73c / (long)local_71c & 0xffffffffU) / (long)local_718;
        local_720 = (int)((long)((ulong)(uint)((int)uVar4 >> 0x1f) << 0x20 | uVar4 & 0xffffffff) /
                         (long)local_714);
      }
    }
    local_8ac = 1;
    if (((*(byte *)((long)local_700 + 0x27) & 1) != 0) && (local_8ac = 1, local_720 % 4 == 0)) {
      local_8ac = 4;
    }
    local_8b8 = (local_738 / (ulong)(long)local_72c) * (long)local_8ac;
    if ((((local_728 == 3) || (local_728 == 4)) && (local_708->c * local_72c == local_720)) &&
       (local_72c == local_8ac)) {
      local_698 = local_710;
      local_6a0 = local_708;
      if (local_710 != local_708) {
        if (local_708->refcount != (int *)0x0) {
          piVar1 = local_708->refcount;
          local_6a4 = 1;
          LOCK();
          local_6a8 = *piVar1;
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        local_118 = local_710;
        if (local_710->refcount != (int *)0x0) {
          piVar1 = local_710->refcount;
          local_11c = 0xffffffff;
          LOCK();
          local_120 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_120 == 1) {
            if (local_710->allocator == (Allocator *)0x0) {
              local_110 = local_710->data;
              if (local_110 != (void *)0x0) {
                free(local_110);
              }
            }
            else {
              (*local_710->allocator->_vptr_Allocator[3])
                        (local_710->allocator,local_710->data,local_738 % (ulong)(long)local_72c);
            }
          }
        }
        pvVar2->data = (void *)0x0;
        pvVar2->elemsize = 0;
        pvVar2->elempack = 0;
        pvVar2->dims = 0;
        pvVar2->w = 0;
        pvVar2->h = 0;
        pvVar2->d = 0;
        pvVar2->c = 0;
        pvVar2->cstep = 0;
        pvVar2->refcount = (int *)0x0;
        pvVar2->data = local_6a0->data;
        pvVar2->refcount = local_6a0->refcount;
        pvVar2->elemsize = local_6a0->elemsize;
        pvVar2->elempack = local_6a0->elempack;
        pvVar2->allocator = local_6a0->allocator;
        pvVar2->dims = local_6a0->dims;
        pvVar2->w = local_6a0->w;
        pvVar2->h = local_6a0->h;
        pvVar2->d = local_6a0->d;
        pvVar2->c = local_6a0->c;
        pvVar2->cstep = local_6a0->cstep;
      }
      local_710->dims = *(int *)(in_RDI + 0xe0);
      local_710->w = local_714;
      local_710->h = local_718;
      local_710->d = local_71c;
      return 0;
    }
    local_650 = &local_900;
    local_658 = local_708;
    local_900 = local_708->data;
    local_8f8 = local_708->refcount;
    local_8f0 = local_708->elemsize;
    local_8e8 = local_708->elempack;
    local_8e0 = local_708->allocator;
    local_8d8 = local_708->dims;
    local_8d4 = local_708->w;
    local_8d0 = local_708->h;
    local_8cc = local_708->d;
    local_8c8 = local_708->c;
    local_8c0 = local_708->cstep;
    if (local_8f8 != (int *)0x0) {
      local_ac = 1;
      LOCK();
      local_b0 = *local_8f8;
      *local_8f8 = *local_8f8 + 1;
      UNLOCK();
    }
    local_948 = *local_700;
    local_938 = local_700[2];
    uStack_930 = local_700[3];
    local_928 = local_700[4];
    uStack_920 = local_700[5];
    local_918 = local_700[6];
    uStack_910 = local_700[7];
    uStack_940 = local_700[2];
    local_a8 = local_650;
    flatten(in_stack_fffffffffffff230,in_stack_fffffffffffff228,(Option *)in_stack_fffffffffffff220)
    ;
    local_6d0 = &local_900;
    if (local_900 != (void *)0x0) {
      local_1e0 = local_6d0;
    }
    if (local_900 != (void *)0x0 && local_8c0 * (long)local_8c8 != 0) {
      iVar3 = (int)((ulong)in_stack_fffffffffffff200 >> 0x20);
      if (*(int *)(in_RDI + 0xe0) == 3) {
        Mat::create(in_stack_fffffffffffff220,(int)((ulong)in_stack_fffffffffffff218 >> 0x20),
                    (int)in_stack_fffffffffffff218,(int)((ulong)in_stack_fffffffffffff210 >> 0x20),
                    in_stack_fffffffffffff208,iVar3,
                    (Allocator *)CONCAT44(in_stack_fffffffffffff284,in_stack_fffffffffffff280));
      }
      else {
        Mat::create(in_stack_fffffffffffff210,(int)(in_stack_fffffffffffff208 >> 0x20),
                    (int)in_stack_fffffffffffff208,iVar3,(int)in_stack_fffffffffffff200,
                    in_stack_fffffffffffff1f8,in_stack_fffffffffffff270,
                    (Allocator *)CONCAT44(in_stack_fffffffffffff27c,in_stack_fffffffffffff278));
      }
      local_6d8 = local_710;
      bVar5 = true;
      if (local_710->data != (void *)0x0) {
        local_1d8 = local_710;
        bVar5 = local_710->cstep * (long)local_710->c == 0;
      }
      if (bVar5) {
        local_6dc = -100;
        local_7e8 = 1;
      }
      else {
        local_94c = local_710->w * local_710->h * local_710->d;
        if (local_8ac == 4) {
          for (local_950 = 0; local_950 < local_710->c; local_950 = local_950 + 1) {
            local_628 = &local_900;
            local_958 = (undefined8 *)((long)local_900 + (long)(local_94c * local_950 * 4) * 4);
            local_630 = &local_900;
            local_960 = (undefined8 *)
                        ((long)local_900 + (long)(local_94c * (local_950 * 4 + 1)) * 4);
            local_638 = &local_900;
            local_968 = (undefined8 *)
                        ((long)local_900 + (long)(local_94c * (local_950 * 4 + 2)) * 4);
            local_640 = &local_900;
            local_970 = (undefined8 *)
                        ((long)local_900 + (long)(local_94c * (local_950 * 4 + 3)) * 4);
            local_220 = &local_9c0;
            local_64 = local_710->w;
            local_68 = local_710->h;
            local_6c = local_710->d;
            local_78 = (undefined8 *)
                       ((long)local_710->data +
                       local_710->cstep * (long)local_950 * local_710->elemsize);
            local_80 = local_710->elemsize;
            local_84 = local_710->elempack;
            local_90 = local_710->allocator;
            local_60 = &local_9c0;
            local_8 = (long)local_64 * (long)local_68 * local_80;
            local_c = 0x10;
            local_228 = local_710;
            local_22c = local_950;
            local_22d = 1;
            local_208 = &local_9c0;
            local_280 = &local_9c0;
            local_9c0 = 0;
            local_9b0 = 0;
            local_9a8 = 0;
            local_998 = 0;
            local_994 = 0;
            local_990 = 0;
            local_98c = 0;
            local_988 = 0;
            local_980 = 0;
            local_9b8 = 0;
            local_978 = local_78;
            for (local_9c4 = 0; local_9c4 + 3 < local_94c; local_9c4 = local_9c4 + 4) {
              local_5d0 = local_958;
              local_4f8 = *local_958;
              uStack_570 = local_958[1];
              local_5d8 = local_960;
              local_508 = *local_960;
              uStack_580 = local_960[1];
              local_5e0 = local_968;
              local_518 = *local_968;
              uStack_590 = local_968[1];
              local_5e8 = local_970;
              local_528 = *local_970;
              uStack_5a0 = local_970[1];
              local_578._0_4_ = (undefined4)local_4f8;
              local_578._4_4_ = (undefined4)((ulong)local_4f8 >> 0x20);
              local_588._0_4_ = (undefined4)local_508;
              local_588._4_4_ = (undefined4)((ulong)local_508 >> 0x20);
              local_a48 = CONCAT44((undefined4)local_588,(undefined4)local_578);
              uStack_a40 = CONCAT44(local_588._4_4_,local_578._4_4_);
              local_598._0_4_ = (undefined4)local_518;
              local_598._4_4_ = (undefined4)((ulong)local_518 >> 0x20);
              local_5a8._0_4_ = (undefined4)local_528;
              local_5a8._4_4_ = (undefined4)((ulong)local_528 >> 0x20);
              local_a28 = CONCAT44((undefined4)local_5a8,(undefined4)local_598);
              uStack_a20 = CONCAT44(local_5a8._4_4_,local_598._4_4_);
              uStack_4f0._0_4_ = (undefined4)uStack_570;
              uStack_4f0._4_4_ = (undefined4)((ulong)uStack_570 >> 0x20);
              uStack_500._0_4_ = (undefined4)uStack_580;
              uStack_500._4_4_ = (undefined4)((ulong)uStack_580 >> 0x20);
              local_a38 = CONCAT44((undefined4)uStack_500,(undefined4)uStack_4f0);
              uStack_a30 = CONCAT44(uStack_500._4_4_,uStack_4f0._4_4_);
              uStack_510._0_4_ = (undefined4)uStack_590;
              uStack_510._4_4_ = (undefined4)((ulong)uStack_590 >> 0x20);
              uStack_520._0_4_ = (undefined4)uStack_5a0;
              uStack_520._4_4_ = (undefined4)((ulong)uStack_5a0 >> 0x20);
              local_a18 = CONCAT44((undefined4)uStack_520,(undefined4)uStack_510);
              uStack_a10 = CONCAT44(uStack_520._4_4_,uStack_510._4_4_);
              local_9d8 = CONCAT44((undefined4)local_588,(undefined4)local_578);
              uStack_9d0 = CONCAT44((undefined4)local_5a8,(undefined4)local_598);
              local_9e8 = CONCAT44(local_588._4_4_,local_578._4_4_);
              uStack_9e0 = CONCAT44(local_5a8._4_4_,local_598._4_4_);
              local_9f8 = CONCAT44((undefined4)uStack_500,(undefined4)uStack_4f0);
              uStack_9f0 = CONCAT44((undefined4)uStack_520,(undefined4)uStack_510);
              local_a08 = CONCAT44(uStack_500._4_4_,uStack_4f0._4_4_);
              uStack_a00 = CONCAT44(uStack_520._4_4_,uStack_510._4_4_);
              local_310 = local_978;
              *local_978 = local_9d8;
              local_978[1] = uStack_9d0;
              local_330 = local_978 + 2;
              *local_330 = local_9e8;
              local_978[3] = uStack_9e0;
              local_350 = local_978 + 4;
              *local_350 = local_9f8;
              local_978[5] = uStack_9f0;
              local_370 = local_978 + 6;
              *local_370 = local_a08;
              local_978[7] = uStack_a00;
              local_958 = local_958 + 2;
              local_960 = local_960 + 2;
              local_968 = local_968 + 2;
              local_970 = local_970 + 2;
              local_978 = local_978 + 8;
              local_5a8 = local_528;
              local_598 = local_518;
              local_588 = local_508;
              local_578 = local_4f8;
              uStack_520 = uStack_5a0;
              uStack_510 = uStack_590;
              uStack_500 = uStack_580;
              uStack_4f0 = uStack_570;
              local_4a8 = local_a18;
              uStack_4a0 = uStack_a10;
              local_498 = local_a38;
              uStack_490 = uStack_a30;
              local_488 = local_a28;
              uStack_480 = uStack_a20;
              local_478 = local_a48;
              uStack_470 = uStack_a40;
              local_428 = local_a38;
              uStack_420 = uStack_a30;
              local_418 = local_a18;
              uStack_410 = uStack_a10;
              local_408 = local_a48;
              uStack_400 = uStack_a40;
              local_3f8 = local_a28;
              uStack_3f0 = uStack_a20;
              local_388 = local_a08;
              uStack_380 = uStack_a00;
              local_368 = local_9f8;
              uStack_360 = uStack_9f0;
              local_348 = local_9e8;
              uStack_340 = uStack_9e0;
              local_328 = local_9d8;
              uStack_320 = uStack_9d0;
            }
            for (; local_9c4 < local_94c; local_9c4 = local_9c4 + 1) {
              *(undefined4 *)local_978 = *(undefined4 *)local_958;
              *(undefined4 *)((long)local_978 + 4) = *(undefined4 *)local_960;
              *(undefined4 *)(local_978 + 1) = *(undefined4 *)local_968;
              *(undefined4 *)((long)local_978 + 0xc) = *(undefined4 *)local_970;
              local_978 = local_978 + 2;
              local_970 = (undefined8 *)((long)local_970 + 4);
              local_968 = (undefined8 *)((long)local_968 + 4);
              local_960 = (undefined8 *)((long)local_960 + 4);
              local_958 = (undefined8 *)((long)local_958 + 4);
            }
            local_158 = local_280;
            local_9a0 = local_90;
          }
        }
        if (local_8ac == 1) {
          for (local_a4c = 0; local_a4c < local_710->c; local_a4c = local_a4c + 1) {
            local_648 = &local_900;
            local_a58 = (undefined8 *)((long)local_900 + (long)(local_94c * local_a4c) * 4);
            local_240 = &local_aa8;
            local_2c = local_710->w;
            local_30 = local_710->h;
            local_34 = local_710->d;
            local_40 = (undefined8 *)
                       ((long)local_710->data +
                       local_710->cstep * (long)local_a4c * local_710->elemsize);
            local_48 = local_710->elemsize;
            local_4c = local_710->elempack;
            local_58 = local_710->allocator;
            local_28 = &local_aa8;
            local_18 = (long)local_2c * (long)local_30 * local_48;
            local_210 = &local_aa8;
            local_270 = &local_aa8;
            local_1c = 0x10;
            local_248 = local_710;
            local_24c = local_a4c;
            local_24d = 1;
            local_aa8 = 0;
            local_a98 = 0;
            local_a90 = 0;
            local_a80 = 0;
            local_a7c = 0;
            local_a78 = 0;
            local_a74 = 0;
            local_a70 = 0;
            local_a68 = 0;
            local_aa0 = 0;
            local_a60 = local_40;
            for (local_aac = 0; local_aac + 3 < local_94c; local_aac = local_aac + 4) {
              local_5f0 = local_a58;
              local_3a8 = *local_a58;
              uStack_3a0 = local_a58[1];
              local_390 = local_a60;
              *local_a60 = local_3a8;
              local_a60[1] = uStack_3a0;
              local_a58 = local_a58 + 2;
              local_a60 = local_a60 + 2;
            }
            for (; local_aac < local_94c; local_aac = local_aac + 1) {
              *(undefined4 *)local_a60 = *(undefined4 *)local_a58;
              local_a60 = (undefined8 *)((long)local_a60 + 4);
              local_a58 = (undefined8 *)((long)local_a58 + 4);
            }
            local_178 = local_270;
            local_a88 = local_58;
          }
        }
        local_7e8 = 0;
      }
    }
    else {
      local_6dc = -100;
      local_7e8 = 1;
    }
    ppvVar6 = &local_900;
    if (local_8f8 != (int *)0x0) {
      local_19c = 0xffffffff;
      LOCK();
      local_1a0 = *local_8f8;
      *local_8f8 = *local_8f8 + -1;
      UNLOCK();
      if (local_1a0 == 1) {
        local_260 = ppvVar6;
        local_198 = ppvVar6;
        if (local_8e0 == (Allocator *)0x0) {
          local_d0 = local_900;
          if (local_900 != (void *)0x0) {
            free(local_900);
          }
        }
        else {
          (*local_8e0->_vptr_Allocator[3])(local_8e0,local_900);
        }
      }
    }
    *ppvVar6 = (void *)0x0;
    ppvVar6[2] = (void *)0x0;
    *(undefined4 *)(ppvVar6 + 3) = 0;
    *(undefined4 *)(ppvVar6 + 5) = 0;
    *(undefined4 *)((long)ppvVar6 + 0x2c) = 0;
    *(undefined4 *)(ppvVar6 + 6) = 0;
    *(undefined4 *)((long)ppvVar6 + 0x34) = 0;
    *(undefined4 *)(ppvVar6 + 7) = 0;
    ppvVar6[8] = (void *)0x0;
    ppvVar6[1] = (void *)0x0;
    if (local_7e8 != 0) {
      return local_6dc;
    }
  }
  return 0;
}

Assistant:

int Reshape_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    Mat& top_blob = top_blobs[0];

    // resolve out shape
    int outw = w;
    int outh = h;
    int outd = d;
    int outc = c;

    if (!shape_expr.empty())
    {
        int er = eval_shape_expr(bottom_blobs, outw, outh, outd, outc);
        if (er != 0)
            return -1;
    }

    if (ndim == 1)
    {
        // flatten
        flatten(bottom_blob, top_blob, opt);
        if (top_blob.empty())
            return -100;

        return 0;
    }

    const int dims = bottom_blob.dims;
    const int elempack = bottom_blob.elempack;
    const size_t elemsize = bottom_blob.elemsize;

    const int total = bottom_blob.w * bottom_blob.h * bottom_blob.d * bottom_blob.c * elempack;

    if (ndim == 2)
    {
        if (outw == 0)
            outw = dims == 1 ? bottom_blob.w * elempack : bottom_blob.w;
        if (outh == 0)
            outh = dims == 2 ? bottom_blob.h * elempack : bottom_blob.h;

        if (outw == -1)
            outw = total / outh;
        if (outh == -1)
            outh = total / outw;

        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            out_elempack = outh % 16 == 0 ? 16 : outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#elif __AVX__
            out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#else
            out_elempack = outh % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__
        size_t out_elemsize = elemsize / elempack * out_elempack;

        if (dims == 2 && bottom_blob.h * elempack == outh && elempack == out_elempack)
        {
            top_blob = bottom_blob;
            return 0;
        }

        if (out_elempack == 1)
        {
            // flatten
            flatten(bottom_blob, top_blob, opt);
            if (top_blob.empty())
                return -100;

            top_blob.dims = 2;
            top_blob.w = outw;
            top_blob.h = outh;
            top_blob.cstep = (size_t)outw * outh;
            top_blob.elemsize = out_elemsize;
            top_blob.elempack = out_elempack;

            return 0;
        }

        // flatten
        Mat bottom_blob_flattened = bottom_blob;
        {
            Option opt_flatten = opt;
            opt_flatten.blob_allocator = opt.workspace_allocator;

            flatten(bottom_blob, bottom_blob_flattened, opt_flatten);
            if (bottom_blob_flattened.empty())
                return -100;
        }

        top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (out_elempack == 16)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < top_blob.h; i++)
            {
                const float* ptr0 = (const float*)bottom_blob_flattened + outw * i * 16;
                const float* ptr1 = (const float*)bottom_blob_flattened + outw * (i * 16 + 1);
                const float* ptr2 = (const float*)bottom_blob_flattened + outw * (i * 16 + 2);
                const float* ptr3 = (const float*)bottom_blob_flattened + outw * (i * 16 + 3);
                const float* ptr4 = (const float*)bottom_blob_flattened + outw * (i * 16 + 4);
                const float* ptr5 = (const float*)bottom_blob_flattened + outw * (i * 16 + 5);
                const float* ptr6 = (const float*)bottom_blob_flattened + outw * (i * 16 + 6);
                const float* ptr7 = (const float*)bottom_blob_flattened + outw * (i * 16 + 7);
                const float* ptr8 = (const float*)bottom_blob_flattened + outw * (i * 16 + 8);
                const float* ptr9 = (const float*)bottom_blob_flattened + outw * (i * 16 + 9);
                const float* ptra = (const float*)bottom_blob_flattened + outw * (i * 16 + 10);
                const float* ptrb = (const float*)bottom_blob_flattened + outw * (i * 16 + 11);
                const float* ptrc = (const float*)bottom_blob_flattened + outw * (i * 16 + 12);
                const float* ptrd = (const float*)bottom_blob_flattened + outw * (i * 16 + 13);
                const float* ptre = (const float*)bottom_blob_flattened + outw * (i * 16 + 14);
                const float* ptrf = (const float*)bottom_blob_flattened + outw * (i * 16 + 15);
                float* outptr = top_blob.row(i);

                int j = 0;
                for (; j + 15 < outw; j += 16)
                {
                    __m512 _row0 = _mm512_loadu_ps(ptr0);
                    __m512 _row1 = _mm512_loadu_ps(ptr1);
                    __m512 _row2 = _mm512_loadu_ps(ptr2);
                    __m512 _row3 = _mm512_loadu_ps(ptr3);
                    __m512 _row4 = _mm512_loadu_ps(ptr4);
                    __m512 _row5 = _mm512_loadu_ps(ptr5);
                    __m512 _row6 = _mm512_loadu_ps(ptr6);
                    __m512 _row7 = _mm512_loadu_ps(ptr7);
                    __m512 _row8 = _mm512_loadu_ps(ptr8);
                    __m512 _row9 = _mm512_loadu_ps(ptr9);
                    __m512 _rowa = _mm512_loadu_ps(ptra);
                    __m512 _rowb = _mm512_loadu_ps(ptrb);
                    __m512 _rowc = _mm512_loadu_ps(ptrc);
                    __m512 _rowd = _mm512_loadu_ps(ptrd);
                    __m512 _rowe = _mm512_loadu_ps(ptre);
                    __m512 _rowf = _mm512_loadu_ps(ptrf);

                    transpose16x16_ps(_row0, _row1, _row2, _row3, _row4, _row5, _row6, _row7, _row8, _row9, _rowa, _rowb, _rowc, _rowd, _rowe, _rowf);

                    _mm512_storeu_ps(outptr, _row0);
                    _mm512_storeu_ps(outptr + 16, _row1);
                    _mm512_storeu_ps(outptr + 16 * 2, _row2);
                    _mm512_storeu_ps(outptr + 16 * 3, _row3);
                    _mm512_storeu_ps(outptr + 16 * 4, _row4);
                    _mm512_storeu_ps(outptr + 16 * 5, _row5);
                    _mm512_storeu_ps(outptr + 16 * 6, _row6);
                    _mm512_storeu_ps(outptr + 16 * 7, _row7);
                    _mm512_storeu_ps(outptr + 16 * 8, _row8);
                    _mm512_storeu_ps(outptr + 16 * 9, _row9);
                    _mm512_storeu_ps(outptr + 16 * 10, _rowa);
                    _mm512_storeu_ps(outptr + 16 * 11, _rowb);
                    _mm512_storeu_ps(outptr + 16 * 12, _rowc);
                    _mm512_storeu_ps(outptr + 16 * 13, _rowd);
                    _mm512_storeu_ps(outptr + 16 * 14, _rowe);
                    _mm512_storeu_ps(outptr + 16 * 15, _rowf);

                    ptr0 += 16;
                    ptr1 += 16;
                    ptr2 += 16;
                    ptr3 += 16;
                    ptr4 += 16;
                    ptr5 += 16;
                    ptr6 += 16;
                    ptr7 += 16;
                    ptr8 += 16;
                    ptr9 += 16;
                    ptra += 16;
                    ptrb += 16;
                    ptrc += 16;
                    ptrd += 16;
                    ptre += 16;
                    ptrf += 16;
                    outptr += 256;
                }
                for (; j < outw; j++)
                {
                    outptr[0] = *ptr0++;
                    outptr[1] = *ptr1++;
                    outptr[2] = *ptr2++;
                    outptr[3] = *ptr3++;
                    outptr[4] = *ptr4++;
                    outptr[5] = *ptr5++;
                    outptr[6] = *ptr6++;
                    outptr[7] = *ptr7++;
                    outptr[8] = *ptr8++;
                    outptr[9] = *ptr9++;
                    outptr[10] = *ptra++;
                    outptr[11] = *ptrb++;
                    outptr[12] = *ptrc++;
                    outptr[13] = *ptrd++;
                    outptr[14] = *ptre++;
                    outptr[15] = *ptrf++;

                    outptr += 16;
                }
            }
        }
#endif // __AVX512F__

        if (out_elempack == 8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < top_blob.h; i++)
            {
                const float* ptr0 = (const float*)bottom_blob_flattened + outw * i * 8;
                const float* ptr1 = (const float*)bottom_blob_flattened + outw * (i * 8 + 1);
                const float* ptr2 = (const float*)bottom_blob_flattened + outw * (i * 8 + 2);
                const float* ptr3 = (const float*)bottom_blob_flattened + outw * (i * 8 + 3);
                const float* ptr4 = (const float*)bottom_blob_flattened + outw * (i * 8 + 4);
                const float* ptr5 = (const float*)bottom_blob_flattened + outw * (i * 8 + 5);
                const float* ptr6 = (const float*)bottom_blob_flattened + outw * (i * 8 + 6);
                const float* ptr7 = (const float*)bottom_blob_flattened + outw * (i * 8 + 7);
                float* outptr = top_blob.row(i);

                int j = 0;
                for (; j + 7 < outw; j += 8)
                {
                    __m256 _row0 = _mm256_loadu_ps(ptr0);
                    __m256 _row1 = _mm256_loadu_ps(ptr1);
                    __m256 _row2 = _mm256_loadu_ps(ptr2);
                    __m256 _row3 = _mm256_loadu_ps(ptr3);
                    __m256 _row4 = _mm256_loadu_ps(ptr4);
                    __m256 _row5 = _mm256_loadu_ps(ptr5);
                    __m256 _row6 = _mm256_loadu_ps(ptr6);
                    __m256 _row7 = _mm256_loadu_ps(ptr7);

                    transpose8x8_ps(_row0, _row1, _row2, _row3, _row4, _row5, _row6, _row7);

                    _mm256_storeu_ps(outptr, _row0);
                    _mm256_storeu_ps(outptr + 8, _row1);
                    _mm256_storeu_ps(outptr + 16, _row2);
                    _mm256_storeu_ps(outptr + 24, _row3);
                    _mm256_storeu_ps(outptr + 32, _row4);
                    _mm256_storeu_ps(outptr + 40, _row5);
                    _mm256_storeu_ps(outptr + 48, _row6);
                    _mm256_storeu_ps(outptr + 56, _row7);

                    ptr0 += 8;
                    ptr1 += 8;
                    ptr2 += 8;
                    ptr3 += 8;
                    ptr4 += 8;
                    ptr5 += 8;
                    ptr6 += 8;
                    ptr7 += 8;
                    outptr += 64;
                }
                for (; j < outw; j++)
                {
                    outptr[0] = *ptr0++;
                    outptr[1] = *ptr1++;
                    outptr[2] = *ptr2++;
                    outptr[3] = *ptr3++;
                    outptr[4] = *ptr4++;
                    outptr[5] = *ptr5++;
                    outptr[6] = *ptr6++;
                    outptr[7] = *ptr7++;

                    outptr += 8;
                }
            }
        }
#endif // __AVX__

        if (out_elempack == 4)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < top_blob.h; i++)
            {
                const float* ptr0 = (const float*)bottom_blob_flattened + outw * i * 4;
                const float* ptr1 = (const float*)bottom_blob_flattened + outw * (i * 4 + 1);
                const float* ptr2 = (const float*)bottom_blob_flattened + outw * (i * 4 + 2);
                const float* ptr3 = (const float*)bottom_blob_flattened + outw * (i * 4 + 3);
                float* outptr = top_blob.row(i);

                int j = 0;
                for (; j + 3 < outw; j += 4)
                {
                    __m128 _row0 = _mm_loadu_ps(ptr0);
                    __m128 _row1 = _mm_loadu_ps(ptr1);
                    __m128 _row2 = _mm_loadu_ps(ptr2);
                    __m128 _row3 = _mm_loadu_ps(ptr3);

                    _MM_TRANSPOSE4_PS(_row0, _row1, _row2, _row3);

                    _mm_storeu_ps(outptr, _row0);
                    _mm_storeu_ps(outptr + 4, _row1);
                    _mm_storeu_ps(outptr + 8, _row2);
                    _mm_storeu_ps(outptr + 12, _row3);

                    ptr0 += 4;
                    ptr1 += 4;
                    ptr2 += 4;
                    ptr3 += 4;
                    outptr += 16;
                }
                for (; j < outw; j++)
                {
                    outptr[0] = *ptr0++;
                    outptr[1] = *ptr1++;
                    outptr[2] = *ptr2++;
                    outptr[3] = *ptr3++;

                    outptr += 4;
                }
            }
        }
#endif // __SSE2__
    }

    if (ndim == 3 || ndim == 4)
    {
        if (ndim == 3)
        {
            if (outw == 0)
                outw = dims == 1 ? bottom_blob.w * elempack : bottom_blob.w;
            if (outh == 0)
                outh = dims == 2 ? bottom_blob.h * elempack : bottom_blob.h;
            if (outc == 0)
                outc = dims == 3 ? bottom_blob.c * elempack : bottom_blob.c;

            if (outw == -1)
                outw = total / outc / outh;
            if (outh == -1)
                outh = total / outc / outw;
            if (outc == -1)
                outc = total / outh / outw;

            outd = 1;
        }
        else // if (ndim == 4)
        {
            if (outw == 0)
                outw = dims == 1 ? bottom_blob.w * elempack : bottom_blob.w;
            if (outh == 0)
                outh = dims == 2 ? bottom_blob.h * elempack : bottom_blob.h;
            if (outd == 0)
                outd = bottom_blob.d;
            if (outc == 0)
                outc = (dims == 3 || dims == 4) ? bottom_blob.c * elempack : bottom_blob.c;

            if (outw == -1)
                outw = total / outc / outd / outh;
            if (outh == -1)
                outh = total / outc / outd / outw;
            if (outd == -1)
                outd = total / outc / outh / outw;
            if (outc == -1)
                outc = total / outd / outh / outw;
        }

        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            out_elempack = outc % 16 == 0 ? 16 : outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
#elif __AVX__
            out_elempack = outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
#else
            out_elempack = outc % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__
        size_t out_elemsize = elemsize / elempack * out_elempack;

        if ((dims == 3 || dims == 4) && bottom_blob.c * elempack == outc && elempack == out_elempack)
        {
            top_blob = bottom_blob;
            top_blob.dims = ndim;
            top_blob.w = outw;
            top_blob.h = outh;
            top_blob.d = outd;
            return 0;
        }

        // flatten
        Mat bottom_blob_flattened = bottom_blob;
        {
            Option opt_flatten = opt;
            opt_flatten.blob_allocator = opt.workspace_allocator;

            flatten(bottom_blob, bottom_blob_flattened, opt_flatten);
            if (bottom_blob_flattened.empty())
                return -100;
        }

        if (ndim == 3)
        {
            top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        }
        else // if (ndim == 4)
        {
            top_blob.create(outw, outh, outd, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        }
        if (top_blob.empty())
            return -100;

        int size = top_blob.w * top_blob.h * top_blob.d;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (out_elempack == 16)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < top_blob.c; q++)
            {
                const float* ptr0 = (const float*)bottom_blob_flattened + size * q * 16;
                const float* ptr1 = (const float*)bottom_blob_flattened + size * (q * 16 + 1);
                const float* ptr2 = (const float*)bottom_blob_flattened + size * (q * 16 + 2);
                const float* ptr3 = (const float*)bottom_blob_flattened + size * (q * 16 + 3);
                const float* ptr4 = (const float*)bottom_blob_flattened + size * (q * 16 + 4);
                const float* ptr5 = (const float*)bottom_blob_flattened + size * (q * 16 + 5);
                const float* ptr6 = (const float*)bottom_blob_flattened + size * (q * 16 + 6);
                const float* ptr7 = (const float*)bottom_blob_flattened + size * (q * 16 + 7);
                const float* ptr8 = (const float*)bottom_blob_flattened + size * (q * 16 + 8);
                const float* ptr9 = (const float*)bottom_blob_flattened + size * (q * 16 + 9);
                const float* ptra = (const float*)bottom_blob_flattened + size * (q * 16 + 10);
                const float* ptrb = (const float*)bottom_blob_flattened + size * (q * 16 + 11);
                const float* ptrc = (const float*)bottom_blob_flattened + size * (q * 16 + 12);
                const float* ptrd = (const float*)bottom_blob_flattened + size * (q * 16 + 13);
                const float* ptre = (const float*)bottom_blob_flattened + size * (q * 16 + 14);
                const float* ptrf = (const float*)bottom_blob_flattened + size * (q * 16 + 15);
                float* outptr = top_blob.channel(q);

                int i = 0;
                for (; i + 15 < size; i += 16)
                {
                    __m512 _row0 = _mm512_loadu_ps(ptr0);
                    __m512 _row1 = _mm512_loadu_ps(ptr1);
                    __m512 _row2 = _mm512_loadu_ps(ptr2);
                    __m512 _row3 = _mm512_loadu_ps(ptr3);
                    __m512 _row4 = _mm512_loadu_ps(ptr4);
                    __m512 _row5 = _mm512_loadu_ps(ptr5);
                    __m512 _row6 = _mm512_loadu_ps(ptr6);
                    __m512 _row7 = _mm512_loadu_ps(ptr7);
                    __m512 _row8 = _mm512_loadu_ps(ptr8);
                    __m512 _row9 = _mm512_loadu_ps(ptr9);
                    __m512 _rowa = _mm512_loadu_ps(ptra);
                    __m512 _rowb = _mm512_loadu_ps(ptrb);
                    __m512 _rowc = _mm512_loadu_ps(ptrc);
                    __m512 _rowd = _mm512_loadu_ps(ptrd);
                    __m512 _rowe = _mm512_loadu_ps(ptre);
                    __m512 _rowf = _mm512_loadu_ps(ptrf);

                    transpose16x16_ps(_row0, _row1, _row2, _row3, _row4, _row5, _row6, _row7, _row8, _row9, _rowa, _rowb, _rowc, _rowd, _rowe, _rowf);

                    _mm512_storeu_ps(outptr, _row0);
                    _mm512_storeu_ps(outptr + 16, _row1);
                    _mm512_storeu_ps(outptr + 16 * 2, _row2);
                    _mm512_storeu_ps(outptr + 16 * 3, _row3);
                    _mm512_storeu_ps(outptr + 16 * 4, _row4);
                    _mm512_storeu_ps(outptr + 16 * 5, _row5);
                    _mm512_storeu_ps(outptr + 16 * 6, _row6);
                    _mm512_storeu_ps(outptr + 16 * 7, _row7);
                    _mm512_storeu_ps(outptr + 16 * 8, _row8);
                    _mm512_storeu_ps(outptr + 16 * 9, _row9);
                    _mm512_storeu_ps(outptr + 16 * 10, _rowa);
                    _mm512_storeu_ps(outptr + 16 * 11, _rowb);
                    _mm512_storeu_ps(outptr + 16 * 12, _rowc);
                    _mm512_storeu_ps(outptr + 16 * 13, _rowd);
                    _mm512_storeu_ps(outptr + 16 * 14, _rowe);
                    _mm512_storeu_ps(outptr + 16 * 15, _rowf);

                    ptr0 += 16;
                    ptr1 += 16;
                    ptr2 += 16;
                    ptr3 += 16;
                    ptr4 += 16;
                    ptr5 += 16;
                    ptr6 += 16;
                    ptr7 += 16;
                    ptr8 += 16;
                    ptr9 += 16;
                    ptra += 16;
                    ptrb += 16;
                    ptrc += 16;
                    ptrd += 16;
                    ptre += 16;
                    ptrf += 16;
                    outptr += 256;
                }
                for (; i < size; i++)
                {
                    outptr[0] = *ptr0++;
                    outptr[1] = *ptr1++;
                    outptr[2] = *ptr2++;
                    outptr[3] = *ptr3++;
                    outptr[4] = *ptr4++;
                    outptr[5] = *ptr5++;
                    outptr[6] = *ptr6++;
                    outptr[7] = *ptr7++;
                    outptr[8] = *ptr8++;
                    outptr[9] = *ptr9++;
                    outptr[10] = *ptra++;
                    outptr[11] = *ptrb++;
                    outptr[12] = *ptrc++;
                    outptr[13] = *ptrd++;
                    outptr[14] = *ptre++;
                    outptr[15] = *ptrf++;

                    outptr += 16;
                }
            }
        }
#endif // __AVX512F__

        if (out_elempack == 8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < top_blob.c; q++)
            {
                const float* ptr0 = (const float*)bottom_blob_flattened + size * q * 8;
                const float* ptr1 = (const float*)bottom_blob_flattened + size * (q * 8 + 1);
                const float* ptr2 = (const float*)bottom_blob_flattened + size * (q * 8 + 2);
                const float* ptr3 = (const float*)bottom_blob_flattened + size * (q * 8 + 3);
                const float* ptr4 = (const float*)bottom_blob_flattened + size * (q * 8 + 4);
                const float* ptr5 = (const float*)bottom_blob_flattened + size * (q * 8 + 5);
                const float* ptr6 = (const float*)bottom_blob_flattened + size * (q * 8 + 6);
                const float* ptr7 = (const float*)bottom_blob_flattened + size * (q * 8 + 7);
                float* outptr = top_blob.channel(q);

                int i = 0;
                for (; i + 7 < size; i += 8)
                {
                    __m256 _row0 = _mm256_loadu_ps(ptr0);
                    __m256 _row1 = _mm256_loadu_ps(ptr1);
                    __m256 _row2 = _mm256_loadu_ps(ptr2);
                    __m256 _row3 = _mm256_loadu_ps(ptr3);
                    __m256 _row4 = _mm256_loadu_ps(ptr4);
                    __m256 _row5 = _mm256_loadu_ps(ptr5);
                    __m256 _row6 = _mm256_loadu_ps(ptr6);
                    __m256 _row7 = _mm256_loadu_ps(ptr7);

                    transpose8x8_ps(_row0, _row1, _row2, _row3, _row4, _row5, _row6, _row7);

                    _mm256_storeu_ps(outptr, _row0);
                    _mm256_storeu_ps(outptr + 8, _row1);
                    _mm256_storeu_ps(outptr + 16, _row2);
                    _mm256_storeu_ps(outptr + 24, _row3);
                    _mm256_storeu_ps(outptr + 32, _row4);
                    _mm256_storeu_ps(outptr + 40, _row5);
                    _mm256_storeu_ps(outptr + 48, _row6);
                    _mm256_storeu_ps(outptr + 56, _row7);

                    ptr0 += 8;
                    ptr1 += 8;
                    ptr2 += 8;
                    ptr3 += 8;
                    ptr4 += 8;
                    ptr5 += 8;
                    ptr6 += 8;
                    ptr7 += 8;
                    outptr += 64;
                }
                for (; i < size; i++)
                {
                    outptr[0] = *ptr0++;
                    outptr[1] = *ptr1++;
                    outptr[2] = *ptr2++;
                    outptr[3] = *ptr3++;
                    outptr[4] = *ptr4++;
                    outptr[5] = *ptr5++;
                    outptr[6] = *ptr6++;
                    outptr[7] = *ptr7++;

                    outptr += 8;
                }
            }
        }
#endif // __AVX__

        if (out_elempack == 4)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < top_blob.c; q++)
            {
                const float* ptr0 = (const float*)bottom_blob_flattened + size * q * 4;
                const float* ptr1 = (const float*)bottom_blob_flattened + size * (q * 4 + 1);
                const float* ptr2 = (const float*)bottom_blob_flattened + size * (q * 4 + 2);
                const float* ptr3 = (const float*)bottom_blob_flattened + size * (q * 4 + 3);
                float* outptr = top_blob.channel(q);

                int i = 0;
                for (; i + 3 < size; i += 4)
                {
                    __m128 _row0 = _mm_loadu_ps(ptr0);
                    __m128 _row1 = _mm_loadu_ps(ptr1);
                    __m128 _row2 = _mm_loadu_ps(ptr2);
                    __m128 _row3 = _mm_loadu_ps(ptr3);

                    _MM_TRANSPOSE4_PS(_row0, _row1, _row2, _row3);

                    _mm_storeu_ps(outptr, _row0);
                    _mm_storeu_ps(outptr + 4, _row1);
                    _mm_storeu_ps(outptr + 8, _row2);
                    _mm_storeu_ps(outptr + 12, _row3);

                    ptr0 += 4;
                    ptr1 += 4;
                    ptr2 += 4;
                    ptr3 += 4;
                    outptr += 16;
                }
                for (; i < size; i++)
                {
                    outptr[0] = *ptr0++;
                    outptr[1] = *ptr1++;
                    outptr[2] = *ptr2++;
                    outptr[3] = *ptr3++;

                    outptr += 4;
                }
            }
        }
#endif // __SSE2__

        if (out_elempack == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < top_blob.c; q++)
            {
                const float* ptr = (const float*)bottom_blob_flattened + size * q;
                float* outptr = top_blob.channel(q);

                int i = 0;
#if __SSE2__
#if __AVX__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _v = _mm256_loadu_ps(ptr);
                    _mm256_storeu_ps(outptr, _v);
                    ptr += 8;
                    outptr += 8;
                }
#endif
                for (; i + 3 < size; i += 4)
                {
                    __m128 _v = _mm_loadu_ps(ptr);
                    _mm_storeu_ps(outptr, _v);
                    ptr += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr++ = *ptr++;
                }
            }
        }
    }

    return 0;
}